

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O2

void zCompRow_to_CompCol(int m,int n,int_t nnz,doublecomplex *a,int_t *colind,int_t *rowptr,
                        doublecomplex **at,int_t **rowind,int_t **colptr)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int_t *piVar4;
  doublecomplex *pdVar5;
  double dVar6;
  doublecomplex *pdVar7;
  int_t *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  pdVar7 = doublecomplexMalloc((long)nnz);
  *at = pdVar7;
  piVar8 = intMalloc(nnz);
  *rowind = piVar8;
  piVar8 = intMalloc(n + 1);
  *colptr = piVar8;
  piVar8 = intCalloc(n);
  uVar9 = 0;
  uVar12 = (ulong)(uint)m;
  if (m < 1) {
    uVar12 = uVar9;
  }
  while (uVar9 != uVar12) {
    piVar1 = rowptr + uVar9;
    uVar9 = uVar9 + 1;
    for (lVar10 = (long)*piVar1; lVar10 < rowptr[uVar9]; lVar10 = lVar10 + 1) {
      piVar8[colind[lVar10]] = piVar8[colind[lVar10]] + 1;
    }
  }
  piVar4 = *colptr;
  *piVar4 = 0;
  uVar11 = 0;
  uVar9 = (ulong)(uint)n;
  if (n < 1) {
    uVar9 = uVar11;
  }
  for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    piVar4[uVar11 + 1] = piVar8[uVar11] + piVar4[uVar11];
    piVar8[uVar11] = piVar4[uVar11];
  }
  uVar9 = 0;
  while (uVar11 = uVar9, uVar11 != uVar12) {
    lVar10 = (long)rowptr[uVar11];
    pdVar7 = a + lVar10;
    for (; uVar9 = uVar11 + 1, lVar10 < rowptr[uVar11 + 1]; lVar10 = lVar10 + 1) {
      iVar2 = colind[lVar10];
      iVar3 = piVar8[iVar2];
      (*rowind)[iVar3] = (int_t)uVar11;
      pdVar5 = *at;
      dVar6 = pdVar7->i;
      pdVar5[iVar3].r = pdVar7->r;
      pdVar5[iVar3].i = dVar6;
      piVar8[iVar2] = piVar8[iVar2] + 1;
      pdVar7 = pdVar7 + 1;
    }
  }
  superlu_free(piVar8);
  return;
}

Assistant:

void
zCompRow_to_CompCol(int m, int n, int_t nnz, 
		    doublecomplex *a, int_t *colind, int_t *rowptr,
		    doublecomplex **at, int_t **rowind, int_t **colptr)
{
    register int i, j, col, relpos;
    int_t *marker;

    /* Allocate storage for another copy of the matrix. */
    *at = (doublecomplex *) doublecomplexMalloc(nnz);
    *rowind = (int_t *) intMalloc(nnz);
    *colptr = (int_t *) intMalloc(n+1);
    marker = (int_t *) intCalloc(n);
    
    /* Get counts of each column of A, and set up column pointers */
    for (i = 0; i < m; ++i)
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) ++marker[colind[j]];
    (*colptr)[0] = 0;
    for (j = 0; j < n; ++j) {
	(*colptr)[j+1] = (*colptr)[j] + marker[j];
	marker[j] = (*colptr)[j];
    }

    /* Transfer the matrix into the compressed column storage. */
    for (i = 0; i < m; ++i) {
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) {
	    col = colind[j];
	    relpos = marker[col];
	    (*rowind)[relpos] = i;
	    (*at)[relpos] = a[j];
	    ++marker[col];
	}
    }

    SUPERLU_FREE(marker);
}